

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_getfenv(lua_State *L,int idx)

{
  int iVar1;
  GCObject *pGVar2;
  StkId pTVar3;
  TValue *pTVar4;
  TValue *o1;
  TValue *o2;
  TValue *i_o_1;
  TValue *i_o;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  pTVar4 = index2adr(L,idx);
  iVar1 = pTVar4->tt;
  if (iVar1 == 6) {
    pTVar3 = L->top;
    pTVar3->value = (Value)(((pTVar4->value).gc)->h).array;
    pTVar3->tt = 5;
  }
  else if (iVar1 == 7) {
    pTVar3 = L->top;
    pTVar3->value = (Value)(((pTVar4->value).gc)->h).array;
    pTVar3->tt = 5;
  }
  else if (iVar1 == 8) {
    pGVar2 = (pTVar4->value).gc;
    pTVar3 = L->top;
    pTVar3->value = (pGVar2->th).l_gt.value;
    pTVar3->tt = (pGVar2->th).l_gt.tt;
  }
  else {
    L->top->tt = 0;
  }
  L->top = L->top + 1;
  return;
}

Assistant:

LUA_API void lua_getfenv (lua_State *L, int idx) {
  StkId o;
  lua_lock(L);
  o = index2adr(L, idx);
  api_checkvalidindex(L, o);
  switch (ttype(o)) {
    case LUA_TFUNCTION:
      sethvalue(L, L->top, clvalue(o)->c.env);
      break;
    case LUA_TUSERDATA:
      sethvalue(L, L->top, uvalue(o)->env);
      break;
    case LUA_TTHREAD:
      setobj2s(L, L->top,  gt(thvalue(o)));
      break;
    default:
      setnilvalue(L->top);
      break;
  }
  api_incr_top(L);
  lua_unlock(L);
}